

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filemgr.cc
# Opt level: O0

fdb_status
filemgr_fetch_header
          (filemgr *file,uint64_t bid,void *buf,size_t *len,fdb_seqnum_t *seqnum,
          filemgr_header_revnum_t *header_revnum,uint64_t *deltasize,uint64_t *version,
          uint64_t *sb_bmp_revnum,err_log_callback *log_callback)

{
  ulong uVar1;
  undefined8 uVar2;
  bool bVar3;
  ushort uVar4;
  void *__src;
  void *buf_00;
  filemgr_magic_t fVar5;
  ulong *in_RCX;
  void *in_RDX;
  void *in_RSI;
  undefined8 *in_RDI;
  ulong *in_R8;
  ulong *in_R9;
  ulong *in_stack_00000008;
  ulong *in_stack_00000010;
  ulong *in_stack_00000018;
  err_log_callback *in_stack_00000020;
  fdb_seqnum_t _seqnum;
  filemgr_header_revnum_t _revnum;
  fdb_status status;
  filemgr_magic_t magic;
  uint64_t _bmp_revnum;
  uint64_t _deltasize;
  filemgr_header_len_t hdr_len;
  err_log_callback *in_stack_00000070;
  uint8_t marker [1];
  uint8_t *_buf;
  void *in_stack_ffffffffffffff40;
  fdb_status local_14;
  
  *in_RCX = 0;
  if ((in_RSI == (void *)0x0) || (in_RSI == (void *)0xffffffffffffffff)) {
    local_14 = FDB_RESULT_SUCCESS;
  }
  else {
    __src = _filemgr_get_temp_buf();
    local_14 = filemgr_read((filemgr *)seqnum,(bid_t)header_revnum,_buf,in_stack_00000070,
                            _deltasize._7_1_);
    if (local_14 == FDB_RESULT_SUCCESS) {
      if (*(char *)((long)__src + ((ulong)*(uint *)(in_RDI + 2) - 1)) == -0x12) {
        uVar1 = *(ulong *)((long)__src + ((ulong)*(uint *)(in_RDI + 2) - 9));
        buf_00 = (void *)(uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                          (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                          (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                          (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38);
        bVar3 = ver_is_valid_magic((filemgr_magic_t)buf_00);
        if (bVar3) {
          uVar4 = *(ushort *)((long)__src + ((ulong)*(uint *)(in_RDI + 2) - 0xb));
          uVar4 = uVar4 >> 8 | uVar4 << 8;
          memcpy(in_RDX,__src,(ulong)uVar4);
          *in_RCX = (ulong)uVar4;
          *in_stack_00000010 = (ulong)buf_00;
          if (in_R9 != (ulong *)0x0) {
            uVar1 = *(ulong *)((long)__src + (long)(int)(uint)uVar4);
            *in_R9 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          }
          if (in_R8 != (ulong *)0x0) {
            uVar1 = *(ulong *)((long)__src + (long)(int)(uint)uVar4 + 8);
            *in_R8 = uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                     (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                     (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 |
                     (uVar1 & 0xff00) << 0x28 | uVar1 << 0x38;
          }
          bVar3 = ver_is_atleast_magic_001((filemgr_magic_t)buf_00);
          if ((bVar3) && (in_stack_00000008 != (ulong *)0x0)) {
            uVar1 = *(ulong *)((long)__src + ((ulong)*(uint *)(in_RDI + 2) - 0x1b));
            *in_stack_00000008 =
                 uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
          }
          if ((in_stack_00000018 != (ulong *)0x0) &&
             (bVar3 = ver_superblock_support((filemgr_magic_t)buf_00), bVar3)) {
            uVar1 = *(ulong *)((long)__src + ((ulong)*(uint *)(in_RDI + 2) - 0x23));
            *in_stack_00000018 =
                 uVar1 >> 0x38 | (uVar1 & 0xff000000000000) >> 0x28 |
                 (uVar1 & 0xff0000000000) >> 0x18 | (uVar1 & 0xff00000000) >> 8 |
                 (uVar1 & 0xff000000) << 8 | (uVar1 & 0xff0000) << 0x18 | (uVar1 & 0xff00) << 0x28 |
                 uVar1 << 0x38;
          }
          _filemgr_release_temp_buf(in_stack_ffffffffffffff40);
        }
        else {
          uVar2 = *in_RDI;
          fVar5 = ver_get_latest_magic();
          fdb_log_impl(in_stack_00000020,3,FDB_RESULT_FILE_CORRUPTION,
                       "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                       ,"filemgr_fetch_header",0x4d0,
                       "A block magic value of %lu in the database header blockid %lu in a database file \'%s\'does NOT match FILEMGR_MAGIC %lu!"
                       ,buf_00,in_RSI,uVar2,fVar5);
          _filemgr_release_temp_buf(buf_00);
          local_14 = FDB_RESULT_FILE_CORRUPTION;
        }
      }
      else {
        _filemgr_release_temp_buf(in_stack_ffffffffffffff40);
        local_14 = FDB_RESULT_READ_FAIL;
      }
    }
    else {
      fdb_log_impl(in_stack_00000020,3,(fdb_status)(ulong)(uint)local_14,
                   "/workspace/llm4binary/github/license_c_cmakelists/ForestDB-KVStore[P]forestdb/src/filemgr.cc"
                   ,"filemgr_fetch_header",0x4b3,
                   "Failed to read a database header with block id %lu in a database file \'%s\'",
                   in_RSI,*in_RDI);
      _filemgr_release_temp_buf(in_RSI);
    }
  }
  return local_14;
}

Assistant:

fdb_status filemgr_fetch_header(struct filemgr *file, uint64_t bid,
                                void *buf, size_t *len, fdb_seqnum_t *seqnum,
                                filemgr_header_revnum_t *header_revnum,
                                uint64_t *deltasize, uint64_t *version,
                                uint64_t *sb_bmp_revnum,
                                err_log_callback *log_callback)
{
    uint8_t *_buf;
    uint8_t marker[BLK_MARKER_SIZE];
    filemgr_header_len_t hdr_len;
    uint64_t _deltasize, _bmp_revnum;
    filemgr_magic_t magic;
    fdb_status status = FDB_RESULT_SUCCESS;

    *len = 0;

    if (!bid || bid == BLK_NOT_FOUND) {
        // No other header available
        return FDB_RESULT_SUCCESS;
    }

    _buf = (uint8_t *)_filemgr_get_temp_buf();

    status = filemgr_read(file, (bid_t)bid, _buf, log_callback, true);

    if (status != FDB_RESULT_SUCCESS) {
        fdb_log(log_callback, FDB_LOG_WARNING, status,
                "Failed to read a database header with block id %" _F64 " in "
                "a database file '%s'", bid, file->filename);
        _filemgr_release_temp_buf(_buf);
        return status;
    }
    memcpy(marker, _buf + file->blocksize - BLK_MARKER_SIZE,
            BLK_MARKER_SIZE);

    if (marker[0] != BLK_MARKER_DBHEADER) {
        // Comment this warning log as of now because the circular block reuse
        // can cause false alarms as a previous stale header block can be reclaimed
        // and reused for incoming writes.
        /*
        fdb_log(log_callback, FDB_RESULT_FILE_CORRUPTION,
                "A block marker of the database header block id %" _F64 " in "
                "a database file '%s' does NOT match BLK_MARKER_DBHEADER!",
                bid, file->filename);
        */
        _filemgr_release_temp_buf(_buf);
        return FDB_RESULT_READ_FAIL;
    }
    memcpy(&magic,
            _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic),
            sizeof(magic));
    magic = _endian_decode(magic);
    if (!ver_is_valid_magic(magic)) {
        fdb_log(log_callback, FDB_LOG_WARNING, FDB_RESULT_FILE_CORRUPTION,
                "A block magic value of %" _F64 " in the database header block"
                "id %" _F64 " in a database file '%s'"
                "does NOT match FILEMGR_MAGIC %" _F64 "!",
                magic, bid, file->filename, ver_get_latest_magic());
        _filemgr_release_temp_buf(_buf);
        return FDB_RESULT_FILE_CORRUPTION;
    }
    memcpy(&hdr_len,
            _buf + file->blocksize - BLK_MARKER_SIZE - sizeof(magic) -
            sizeof(hdr_len), sizeof(hdr_len));
    hdr_len = _endian_decode(hdr_len);

    memcpy(buf, _buf, hdr_len);
    *len = hdr_len;
    *version = magic;

    if (header_revnum) {
        // copy the DB header revnum
        filemgr_header_revnum_t _revnum;
        memcpy(&_revnum, _buf + hdr_len, sizeof(_revnum));
        *header_revnum = _endian_decode(_revnum);
    }
    if (seqnum) {
        // copy default KVS's seqnum
        fdb_seqnum_t _seqnum;
        memcpy(&_seqnum, _buf + hdr_len + sizeof(filemgr_header_revnum_t),
               sizeof(_seqnum));
        *seqnum = _endian_decode(_seqnum);
    }

    if (ver_is_atleast_magic_001(magic)) {
        if (deltasize) {
            memcpy(&_deltasize, _buf + file->blocksize - BLK_MARKER_SIZE
                    - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                    - sizeof(_deltasize), sizeof(_deltasize));
            *deltasize = _endian_decode(_deltasize);
        }
    }

    if (sb_bmp_revnum && ver_superblock_support(magic)) {
        memcpy(&_bmp_revnum, _buf + file->blocksize - BLK_MARKER_SIZE
                - sizeof(magic) - sizeof(hdr_len) - sizeof(bid)
                - sizeof(_deltasize) - sizeof(_bmp_revnum), sizeof(_bmp_revnum));
        *sb_bmp_revnum = _endian_decode(_bmp_revnum);
    }

    _filemgr_release_temp_buf(_buf);

    return status;
}